

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_report_tri_area_normdev(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  int cell;
  char *pcVar4;
  REF_DBL local;
  double local_120;
  double local_118;
  REF_DBL local_110;
  REF_DBL local_108;
  REF_DBL local_100;
  REF_DBL max_uv_area;
  REF_DBL min_uv_area;
  REF_DBL max_area;
  REF_DBL min_area;
  REF_DBL min_normdev;
  REF_DBL uv_area;
  REF_MPI local_c8;
  REF_DBL area_sign;
  REF_DBL area;
  REF_DBL normdev;
  REF_INT nodes [27];
  
  local_c8 = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  min_normdev = 2.0;
  min_area = 1e+200;
  max_area = -1e+200;
  min_uv_area = 1e+200;
  max_uv_area = -1e+200;
  cell = 0;
  local_100 = 2.0;
  local_120 = -1e+200;
  local_110 = -1e+200;
  local_118 = 1e+200;
  local_108 = 1e+200;
  do {
    ref_mpi = local_c8;
    if (ref_cell->max <= cell) {
      local = local_100;
      uVar2 = ref_mpi_min(local_c8,&local,&min_normdev,3);
      if (uVar2 == 0) {
        local = local_108;
        uVar2 = ref_mpi_min(ref_mpi,&local,&min_area,3);
        if (uVar2 == 0) {
          local = local_118;
          uVar2 = ref_mpi_min(ref_mpi,&local,&min_uv_area,3);
          if (uVar2 == 0) {
            local = local_110;
            uVar2 = ref_mpi_max(ref_mpi,&local,&max_area,3);
            if (uVar2 == 0) {
              local = local_120;
              uVar2 = ref_mpi_max(ref_mpi,&local,&max_uv_area,3);
              if (uVar2 == 0) {
                if (ref_mpi->id != 0) {
                  return 0;
                }
                printf("normdev %f area %.5e  %.5e uv area  %.5e  %.5e\n",min_normdev,min_area,
                       max_area,min_uv_area,max_uv_area);
                return 0;
              }
              pcVar4 = "mpi max";
              uVar3 = 0xf0b;
            }
            else {
              pcVar4 = "mpi max";
              uVar3 = 0xf09;
            }
          }
          else {
            pcVar4 = "mpi min";
            uVar3 = 0xf07;
          }
        }
        else {
          pcVar4 = "mpi min";
          uVar3 = 0xf05;
        }
      }
      else {
        pcVar4 = "mpi min";
        uVar3 = 0xf03;
      }
LAB_001407f3:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
             "ref_geom_report_tri_area_normdev",(ulong)uVar2,pcVar4);
      return uVar2;
    }
    RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar1 == 0) {
      uVar2 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
      if (uVar2 != 0) {
        pcVar4 = "norm dev";
        uVar3 = 0xef6;
        goto LAB_001407f3;
      }
      if (normdev <= local_100) {
        local_100 = normdev;
      }
      min_normdev = local_100;
      uVar2 = ref_node_tri_area(ref_grid->node,nodes,&area);
      if (uVar2 != 0) {
        pcVar4 = "vol";
        uVar3 = 0xef8;
        goto LAB_001407f3;
      }
      if (area <= local_108) {
        local_108 = area;
      }
      if (local_110 <= area) {
        local_110 = area;
      }
      max_area = local_110;
      min_area = local_108;
      uVar2 = ref_geom_uv_area_sign(ref_grid,nodes[ref_cell->node_per],&area_sign);
      if (uVar2 != 0) {
        pcVar4 = "a sign";
        uVar3 = 0xefc;
        goto LAB_001407f3;
      }
      uVar2 = ref_geom_uv_area(ref_grid->geom,nodes,&uv_area);
      if (uVar2 != 0) {
        pcVar4 = "uv area";
        uVar3 = 0xefd;
        goto LAB_001407f3;
      }
      uv_area = area_sign * uv_area;
      if (uv_area <= local_118) {
        local_118 = uv_area;
      }
      max_uv_area = local_120;
      min_uv_area = local_118;
      if (local_120 <= uv_area) {
        local_120 = uv_area;
        max_uv_area = uv_area;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_tri_area_normdev(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], id;
  REF_DBL min_normdev, min_area, max_area, min_uv_area, max_uv_area;
  REF_DBL normdev, area, uv_area, area_sign;
  REF_DBL local;

  min_normdev = 2.0;
  min_area = REF_DBL_MAX;
  max_area = REF_DBL_MIN;
  min_uv_area = REF_DBL_MAX;
  max_uv_area = REF_DBL_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    min_normdev = MIN(min_normdev, normdev);
    RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
    min_area = MIN(min_area, area);
    max_area = MAX(max_area, area);
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= area_sign;
    min_uv_area = MIN(min_uv_area, uv_area);
    max_uv_area = MAX(max_uv_area, uv_area);
  }
  local = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &local, &min_normdev, REF_DBL_TYPE), "mpi min");
  local = min_area;
  RSS(ref_mpi_min(ref_mpi, &local, &min_area, REF_DBL_TYPE), "mpi min");
  local = min_uv_area;
  RSS(ref_mpi_min(ref_mpi, &local, &min_uv_area, REF_DBL_TYPE), "mpi min");
  local = max_area;
  RSS(ref_mpi_max(ref_mpi, &local, &max_area, REF_DBL_TYPE), "mpi max");
  local = max_uv_area;
  RSS(ref_mpi_max(ref_mpi, &local, &max_uv_area, REF_DBL_TYPE), "mpi max");

  if (ref_mpi_once(ref_mpi)) {
    printf("normdev %f area %.5e  %.5e uv area  %.5e  %.5e\n", min_normdev,
           min_area, max_area, min_uv_area, max_uv_area);
  }

  return REF_SUCCESS;
}